

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O1

void njoy::ENDFtk::section::Type<32,_151>::CompactRMatrixLimitedUncertainties::ResonanceChannels::
     verifySize(int NPL,int NCH)

{
  undefined8 *puVar1;
  char *args;
  
  if (NPL < 1) {
    tools::Log::error<char_const*>("Encountered empty list");
    args = "NPL should be larger than zero and equal to 6 * NCH";
  }
  else {
    if (NCH < 1) {
      tools::Log::error<char_const*>("Encountered illegal NCH value");
      tools::Log::info<char_const*>("NCH should be larger than zero");
      goto LAB_0012c7a9;
    }
    if (((double)NPL / 6.0 == (double)NCH) && (!NAN((double)NPL / 6.0) && !NAN((double)NCH))) {
      return;
    }
    tools::Log::error<char_const*>("Encountered inconsistent list size");
    args = "NPL must be equal to 6 * NCH";
  }
  tools::Log::info<char_const*>(args);
  tools::Log::info<char_const*,int>("NPL value: {}",NPL);
LAB_0012c7a9:
  tools::Log::info<char_const*,int>("NCH value: {}",NCH);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NPL, int NCH ) {

  if ( NPL < 1 ) {

    Log::error( "Encountered empty list" );
    Log::info( "NPL should be larger than zero and equal to 6 * NCH" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NCH value: {}", NCH );
    throw std::exception();
  }

  if ( NCH < 1 ) {

    Log::error( "Encountered illegal NCH value" );
    Log::info( "NCH should be larger than zero" );
    Log::info( "NCH value: {}", NCH );
    throw std::exception();
  }

  if ( NPL / 6. != NCH ) {

    Log::error( "Encountered inconsistent list size" );
    Log::info( "NPL must be equal to 6 * NCH" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NCH value: {}", NCH );
    throw std::exception();
  }
}